

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

string * __thiscall
flatbuffers::GetAnyValueS_abi_cxx11_
          (string *__return_storage_ptr__,flatbuffers *this,BaseType type,uint8_t *data,
          Schema *schema,int type_index)

{
  uint *puVar1;
  uint uVar2;
  BaseType type_00;
  uint uVar3;
  int64_t t;
  ulong uVar4;
  long lVar5;
  ushort uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  undefined4 in_register_00000014;
  uint *data_00;
  char *pcVar10;
  ulong uVar11;
  int *piVar12;
  Table *table;
  char *pcVar13;
  uint *puVar14;
  flatbuffers *this_00;
  long lVar15;
  double t_00;
  string esc;
  string val;
  string local_98;
  uint *local_78;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  long local_48;
  ulong local_40;
  Field *local_38;
  
  data_00 = (uint *)CONCAT44(in_register_00000014,type);
  type_00 = (BaseType)this;
  switch(type_00) {
  case Float:
  case Double:
    t_00 = GetAnyValueF(type_00,(uint8_t *)data_00);
    FloatToString<double>(__return_storage_ptr__,t_00,0xc);
    return __return_storage_ptr__;
  case String:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)((long)data_00 + (ulong)*data_00 + 4),
               (allocator<char> *)&local_70);
    return __return_storage_ptr__;
  case Vector:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar13 = "[(elements)]";
    pcVar10 = "";
    break;
  case Obj:
    if (data != (uint8_t *)0x0) {
      if ((*(ushort *)(data + -(long)*(int *)data) < 5) ||
         (uVar4 = (ulong)*(ushort *)(data + (4 - (long)*(int *)data)), uVar4 == 0)) {
        puVar14 = (uint *)0x0;
      }
      else {
        puVar14 = (uint *)(data + *(uint *)(data + uVar4) + uVar4);
      }
      local_38 = (Field *)data;
      if ((uint)schema < *puVar14) {
        uVar8 = (ulong)((uint)schema << 2);
        puVar1 = (uint *)(uVar8 + (long)puVar14);
        uVar11 = (ulong)*(uint *)((long)puVar14 + uVar8 + 4);
        piVar12 = (int *)((long)puVar1 + uVar11 + 4);
        uVar4 = (ulong)*(ushort *)((long)piVar12 + (4 - (long)*(int *)(uVar11 + 4 + (long)puVar1)));
        uVar2 = *(uint *)(uVar4 + (long)piVar12);
        lVar5 = (long)piVar12 + (ulong)uVar2 + 4 + uVar4;
        uVar3 = *(uint *)(lVar5 + -4);
        local_50 = &__return_storage_ptr__->field_2;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50;
        local_78 = puVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,lVar5,
                   (long)piVar12 + (ulong)uVar3 + uVar2 + uVar4 + 4);
        lVar5 = (long)*(int *)(uVar11 + 4 + (long)local_78);
        local_40 = uVar11;
        if (((8 < *(ushort *)((long)piVar12 - lVar5)) &&
            (uVar4 = (ulong)*(ushort *)((long)puVar1 + ((uVar11 + 0xc) - lVar5)), uVar4 != 0)) &&
           (*(char *)((long)piVar12 + uVar4) != '\0')) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        uVar2 = *data_00;
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar4 = (ulong)*(ushort *)((long)puVar1 + ((uVar11 + 10) - (long)*piVar12));
        uVar11 = (ulong)*(uint *)((long)piVar12 + uVar4);
        uVar3 = *(uint *)((long)piVar12 + uVar11 + uVar4);
        if ((uVar3 & 0x3fffffff) != 0) {
          this_00 = (flatbuffers *)((long)data_00 + (ulong)uVar2);
          lVar15 = (long)piVar12 + uVar11 + uVar4 + 4;
          local_78 = (uint *)((long)piVar12 + uVar11 + uVar4);
          lVar5 = (long)puVar14 + uVar4 + uVar11 + local_40 + uVar8;
          local_48 = lVar15;
          do {
            uVar4 = (ulong)*(uint *)(lVar5 + 8);
            lVar7 = uVar4 - (long)*(int *)(lVar5 + 8 + uVar4);
            if ((*(ushort *)(lVar5 + 8 + lVar7) < 0xb) ||
               (uVar8 = (ulong)*(ushort *)(lVar5 + 0x12 + lVar7), uVar8 == 0)) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(ushort *)(lVar5 + 8 + uVar8 + uVar4);
            }
            if ((uVar6 < *(ushort *)(this_00 + -(long)*(int *)this_00)) &&
               (*(short *)(this_00 + ((ulong)uVar6 - (long)*(int *)this_00)) != 0)) {
              table = (Table *)(uVar4 + lVar5 + 8);
              GetAnyFieldS_abi_cxx11_(&local_70,this_00,table,local_38,schema);
              lVar7 = (long)*(int *)(lVar5 + 8 + uVar4);
              lVar9 = uVar4 - lVar7;
              if ((*(ushort *)(lVar5 + 8 + lVar9) < 7) ||
                 (uVar8 = (ulong)*(ushort *)(lVar5 + 0xe + lVar9), uVar8 == 0)) {
                piVar12 = (int *)0x0;
              }
              else {
                lVar9 = uVar8 + uVar4;
                piVar12 = (int *)((ulong)*(uint *)(lVar5 + 8 + lVar9) + lVar9 + lVar5 + 8);
              }
              lVar7 = -lVar7;
              if (((4 < *(ushort *)((long)piVar12 - (long)*piVar12)) &&
                  (uVar8 = (ulong)*(ushort *)((long)piVar12 + (4 - (long)*piVar12)), uVar8 != 0)) &&
                 (*(char *)((long)piVar12 + uVar8) == '\r')) {
                local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                local_98._M_string_length = 0;
                local_98.field_2._M_local_buf[0] = '\0';
                schema = (Schema *)0x0;
                EscapeString(local_70._M_dataplus._M_p,local_70._M_string_length,&local_98,true,
                             false);
                std::__cxx11::string::_M_assign((string *)&local_70);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98._M_dataplus._M_p != &local_98.field_2) {
                  operator_delete(local_98._M_dataplus._M_p,
                                  CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                           local_98.field_2._M_local_buf[0]) + 1);
                }
                lVar7 = -(long)*(int *)table;
                lVar15 = local_48;
              }
              lVar9 = *(ushort *)(lVar5 + 0xc + lVar7 + uVar4) + uVar4;
              lVar9 = (ulong)*(uint *)(lVar5 + 8 + lVar9) + lVar9;
              lVar7 = lVar9 + lVar5;
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_98,lVar7 + 0xc,
                         (ulong)*(uint *)(lVar7 + 8) + lVar9 + lVar5 + 0xc);
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,
                                CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                         local_98.field_2._M_local_buf[0]) + 1);
              }
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              uVar3 = *local_78;
            }
            lVar7 = lVar5 + 0xc;
            lVar5 = lVar5 + 4;
          } while (lVar7 != (ulong)(uVar3 * 4) + lVar15);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      __assert_fail("i < size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                    ,0xc1,
                    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
                   );
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar13 = "(table)";
    pcVar10 = "";
    break;
  case Union:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar13 = "(union)";
    pcVar10 = "";
    break;
  default:
    t = GetAnyValueI(type_00,(uint8_t *)data_00);
    NumToString<long>(__return_storage_ptr__,t);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar13,pcVar10);
  return __return_storage_ptr__;
}

Assistant:

std::string GetAnyValueS(reflection::BaseType type, const uint8_t *data,
                         const reflection::Schema *schema, int type_index) {
  switch (type) {
    case reflection::Float:
    case reflection::Double: return NumToString(GetAnyValueF(type, data));
    case reflection::String: {
      auto s =
          reinterpret_cast<const String *>(ReadScalar<uoffset_t>(data) + data);
      return s ? s->c_str() : "";
    }
    case reflection::Obj:
      if (schema) {
        // Convert the table to a string. This is mostly for debugging purposes,
        // and does NOT promise to be JSON compliant.
        // Also prefixes the type.
        auto &objectdef = *schema->objects()->Get(type_index);
        auto s = objectdef.name()->str();
        if (objectdef.is_struct()) {
          s += "(struct)";  // TODO: implement this as well.
        } else {
          auto table_field = reinterpret_cast<const Table *>(
              ReadScalar<uoffset_t>(data) + data);
          s += " { ";
          auto fielddefs = objectdef.fields();
          for (auto it = fielddefs->begin(); it != fielddefs->end(); ++it) {
            auto &fielddef = **it;
            if (!table_field->CheckField(fielddef.offset())) continue;
            auto val = GetAnyFieldS(*table_field, fielddef, schema);
            if (fielddef.type()->base_type() == reflection::String) {
              std::string esc;
              flatbuffers::EscapeString(val.c_str(), val.length(), &esc, true,
                                        false);
              val = esc;
            }
            s += fielddef.name()->str();
            s += ": ";
            s += val;
            s += ", ";
          }
          s += "}";
        }
        return s;
      } else {
        return "(table)";
      }
    case reflection::Vector:
      return "[(elements)]";                   // TODO: implement this as well.
    case reflection::Union: return "(union)";  // TODO: implement this as well.
    default: return NumToString(GetAnyValueI(type, data));
  }
}